

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O3

Status __thiscall spvtools::opt::Pass::Run(Pass *this,IRContext *ctx)

{
  bool bVar1;
  Status SVar2;
  Analysis preserved_analyses;
  
  SVar2 = Failure;
  if (this->already_run_ == false) {
    this->already_run_ = true;
    this->context_ = ctx;
    SVar2 = (*this->_vptr_Pass[4])();
    this->context_ = (IRContext *)0x0;
    if (SVar2 != Failure) {
      if (SVar2 == SuccessWithChange) {
        preserved_analyses = (*this->_vptr_Pass[3])(this);
        IRContext::InvalidateAnalysesExceptFor(ctx,preserved_analyses);
      }
      bVar1 = IRContext::IsConsistent(ctx);
      if (!bVar1) {
        __assert_fail("false && \"An analysis in the context is out of date.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/pass.cpp"
                      ,0x2c,"Pass::Status spvtools::opt::Pass::Run(IRContext *)");
      }
    }
  }
  return SVar2;
}

Assistant:

Pass::Status Pass::Run(IRContext* ctx) {
  if (already_run_) {
    return Status::Failure;
  }
  already_run_ = true;

  context_ = ctx;
  Pass::Status status = Process();
  context_ = nullptr;

  if (status == Status::SuccessWithChange) {
    ctx->InvalidateAnalysesExceptFor(GetPreservedAnalyses());
  }
  if (!(status == Status::Failure || ctx->IsConsistent()))
    assert(false && "An analysis in the context is out of date.");
  return status;
}